

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiPopupData *pIVar4;
  ImGuiWindow *popup_window;
  int n;
  bool ref_window_is_descendent_of_popup;
  ImGuiPopupData *popup;
  int popup_count_to_keep;
  ImGuiContext *g;
  bool restore_focus_to_window_under_popup_local;
  ImGuiWindow *ref_window_local;
  
  pIVar2 = GImGui;
  if ((GImGui->OpenPopupStack).Size != 0) {
    popup._4_4_ = 0;
    if (ref_window != (ImGuiWindow *)0x0) {
      for (; popup._4_4_ < (pIVar2->OpenPopupStack).Size; popup._4_4_ = popup._4_4_ + 1) {
        pIVar4 = ImVector<ImGuiPopupData>::operator[](&pIVar2->OpenPopupStack,popup._4_4_);
        if (pIVar4->Window != (ImGuiWindow *)0x0) {
          if ((pIVar4->Window->Flags & 0x4000000U) == 0) {
            __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                          ,0x262e,"void ImGui::ClosePopupsOverWindow(ImGuiWindow *, bool)");
          }
          if ((pIVar4->Window->Flags & 0x1000000U) == 0) {
            bVar1 = false;
            for (popup_window._0_4_ = popup._4_4_; (int)popup_window < (pIVar2->OpenPopupStack).Size
                ; popup_window._0_4_ = (int)popup_window + 1) {
              pIVar4 = ImVector<ImGuiPopupData>::operator[]
                                 (&pIVar2->OpenPopupStack,(int)popup_window);
              if ((pIVar4->Window != (ImGuiWindow *)0x0) &&
                 (bVar3 = IsWindowWithinBeginStackOf(ref_window,pIVar4->Window), bVar3)) {
                bVar1 = true;
                break;
              }
            }
            if (!bVar1) break;
          }
        }
      }
    }
    if (popup._4_4_ < (pIVar2->OpenPopupStack).Size) {
      ClosePopupToLevel(popup._4_4_,restore_focus_to_window_under_popup);
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size == 0)
        return;

    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack unless the popup is a direct parent of the reference window (the reference window is often the NavWindow)
            // - With this stack of window, clicking/focusing Popup1 will close Popup2 and Popup3:
            //     Window -> Popup1 -> Popup2 -> Popup3
            // - Each popups may contain child windows, which is why we compare ->RootWindowDockTree!
            //     Window -> Popup1 -> Popup1_Child -> Popup2 -> Popup2_Child
            bool ref_window_is_descendent_of_popup = false;
            for (int n = popup_count_to_keep; n < g.OpenPopupStack.Size; n++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[n].Window)
                    //if (popup_window->RootWindowDockTree == ref_window->RootWindowDockTree) // FIXME-MERGE
                    if (IsWindowWithinBeginStackOf(ref_window, popup_window))
                    {
                        ref_window_is_descendent_of_popup = true;
                        break;
                    }
            if (!ref_window_is_descendent_of_popup)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        IMGUI_DEBUG_LOG_POPUP("ClosePopupsOverWindow(\"%s\") -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}